

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::finishCurr
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  bool bVar4;
  TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this_local;
  
  pvVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back(&this->workStack);
  std::
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  ::insert(&this->finished,pvVar2);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::pop_back(&this->workStack);
  while( true ) {
    bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(&this->workStack);
    bVar4 = false;
    if (!bVar1) {
      pvVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::back(&this->workStack);
      sVar3 = std::
              unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              ::count(&this->finished,pvVar2);
      bVar4 = sVar3 != 0;
    }
    if (!bVar4) break;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::pop_back(&this->workStack);
  }
  return;
}

Assistant:

void finishCurr() {
    finished.insert(workStack.back());
    workStack.pop_back();
    while (!workStack.empty() && finished.count(workStack.back())) {
      workStack.pop_back();
    }
  }